

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O0

void __thiscall
mod_verify::ModVerifyTest1<unsigned_char>::ModVerifyTest1(ModVerifyTest1<unsigned_char> *this)

{
  ostream *poVar1;
  uint8_t in_stack_0000000f;
  SafeIntException *anon_var_0_1;
  uchar r_1;
  SafeIntException *anon_var_0;
  uchar r;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> m;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  bool divzero;
  bool expected;
  size_t shift;
  size_t width;
  int *in_stack_fffffffffffffe48;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  undefined8 in_stack_fffffffffffffe60;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs
  ;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [46];
  undefined1 local_a2;
  uchar local_a1;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [57];
  undefined1 local_27;
  uchar local_26;
  uchar local_25;
  undefined4 local_24;
  undefined1 local_1d;
  uchar local_1c;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 1;
  local_18 = 7;
  local_19 = 1;
  local_1c = 0x80;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_1b,&local_1c);
  local_24 = 0;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_27 = local_1d;
  local_26 = (uchar)SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    ::operator%((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                 *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                                (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                 )(uchar)((ulong)in_stack_fffffffffffffe60 >> 0x30));
  rhs.m_int = (uchar)((ulong)in_stack_fffffffffffffe60 >> 0x38);
  local_25 = SafeInt::operator_cast_to_unsigned_char(in_stack_fffffffffffffe50);
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<unsigned_char>();
  poVar1 = std::operator<<(poVar1,local_60);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_60);
  SafeInt::operator_cast_to_unsigned_char(in_stack_fffffffffffffe50);
  to_hex<unsigned_char>(in_stack_0000000f);
  poVar1 = std::operator<<((ostream *)&std::cerr,local_80);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_unsigned_char(in_stack_fffffffffffffe50);
  to_hex<unsigned_char>(in_stack_0000000f);
  poVar1 = std::operator<<(poVar1,local_a0);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_a1 = SafeInt::operator_cast_to_unsigned_char(in_stack_fffffffffffffe50);
  local_a2 = local_1d;
  operator%=((uchar *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),rhs);
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<unsigned_char>();
  poVar1 = std::operator<<(poVar1,local_d0);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_d0);
  SafeInt::operator_cast_to_unsigned_char(in_stack_fffffffffffffe50);
  to_hex<unsigned_char>(in_stack_0000000f);
  poVar1 = std::operator<<((ostream *)&std::cerr,local_f0);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_unsigned_char(in_stack_fffffffffffffe50);
  to_hex<unsigned_char>(in_stack_0000000f);
  poVar1 = std::operator<<(poVar1,local_110);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_f0);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

ModVerifyTest1<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;
		const bool expected = true;

		bool divzero;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m(0);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}
	}